

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::remove_last(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
              *this)

{
  Index local_14;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *local_10;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *this_local;
  
  if (this->nextEventIndex_ != 0) {
    this->nextEventIndex_ = this->nextEventIndex_ - 1;
    local_10 = this;
    _remove_last_in_barcode(this,this->nextEventIndex_);
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
    ::remove_last(&this->mirrorMatrixU_);
    local_14 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
               ::remove_last(&this->reducedMatrixR_);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase(&this->pivotToColumnIndex_,&local_14);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::remove_last()
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_last' is not implemented for the chosen options.");

  if (nextEventIndex_ == 0) return;  // empty matrix
  --nextEventIndex_;

  // assumes PosIdx == MatIdx for boundary matrices.
  _remove_last_in_barcode(nextEventIndex_);

  mirrorMatrixU_.remove_last();
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.erase(reducedMatrixR_.remove_last());
  } else {
    ID_index lastPivot = reducedMatrixR_.remove_last();
    if (lastPivot != Master_matrix::template get_null_value<ID_index>())
      pivotToColumnIndex_[lastPivot] = Master_matrix::template get_null_value<Index>();
  }

  // if has_vine_update and has_column_pairings are both true,
  // then the element is already removed in _remove_last_in_barcode
  if constexpr (Master_matrix::Option_list::has_vine_update && !Master_matrix::Option_list::has_column_pairings) {
    Swap_opt::_positionToRowIdx().erase(nextEventIndex_);
  }
}